

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O2

void __thiscall Farm::removeBasket(Farm *this)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  iterator iVar4;
  ostream *poVar5;
  int iVar6;
  double *pdVar7;
  int i;
  allocator local_ad;
  int nif;
  Basket b;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  std::__cxx11::string::string((string *)&b,"Enter client\'s nif: ",(allocator *)&i);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/Utils.h:20:90)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/Utils.h:20:90)>
             ::_M_manager;
  getOption(&nif,(string *)&b,(function<bool_(int)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::__cxx11::string::~string((string *)&b);
  bVar3 = searchClientByNIF(this,nif);
  if (bVar3) {
    iVar4 = std::
            _Hashtable<int,_std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->baskets)._M_h,&nif);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__cxx11::string::string
                ((string *)&b,"Client doesn\'t have any active baskets to delivery!",(allocator *)&i
                );
      cinERR((string *)&b);
      std::__cxx11::string::~string((string *)&b);
      std::__cxx11::string::string((string *)&b,"ENTER to go back",(allocator *)&i);
      enterWait((string *)&b);
    }
    else {
      line(0x14,'-');
      poVar5 = std::operator<<((ostream *)&std::cout,"Client\'s baskets:");
      std::endl<char,std::char_traits<char>>(poVar5);
      line(0x14,'-');
      i = 0;
      pdVar1 = *(double **)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
                       ._M_cur + 0x18);
      iVar6 = 1;
      for (pdVar7 = *(double **)
                     ((long)iVar4.
                            super__Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
                            ._M_cur + 0x10); pdVar7 != pdVar1; pdVar7 = pdVar7 + 2) {
        b.weight = *pdVar7;
        b._8_8_ = pdVar7[1];
        i = iVar6;
        poVar5 = std::operator<<((ostream *)&std::cout,"ID: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
        std::operator<<(poVar5," | Weight: ");
        dVar2 = Basket::getWeight(&b);
        poVar5 = std::ostream::_M_insert<double>(dVar2);
        std::endl<char,std::char_traits<char>>(poVar5);
        iVar6 = iVar6 + 1;
      }
      std::__cxx11::string::string((string *)&b,"Enter ID of the basket to be removed: ",&local_ad);
      local_50._8_8_ = 0;
      local_50._M_unused._M_object = &i;
      local_38 = std::
                 _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Context/Farm.cpp:261:62)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Context/Farm.cpp:261:62)>
                 ::_M_manager;
      getOption(&nif,(string *)&b,(function<bool_(int)> *)&local_50);
      std::_Function_base::~_Function_base((_Function_base *)&local_50);
      std::__cxx11::string::~string((string *)&b);
      std::vector<Basket,_std::allocator<Basket>_>::erase
                ((vector<Basket,_std::allocator<Basket>_> *)
                 ((long)iVar4.
                        super__Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
                        ._M_cur + 0x10),
                 (((vector<Basket,_std::allocator<Basket>_> *)
                  ((long)iVar4.
                         super__Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
                         ._M_cur + 0x10))->super__Vector_base<Basket,_std::allocator<Basket>_>).
                 _M_impl.super__Vector_impl_data._M_start + nif);
      this->clientsFileChanged = true;
      poVar5 = std::operator<<((ostream *)&std::cout,"Basket successfully removed!");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::string((string *)&b,"ENTER to go back",&local_ad);
      enterWait((string *)&b);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&b,
               "ERROR: Doesn\'t exists a client with the given nif, please create a new one!",
               (allocator *)&i);
    cinERR((string *)&b);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::string::string((string *)&b,"ENTER to go back",(allocator *)&i);
    enterWait((string *)&b);
  }
  std::__cxx11::string::~string((string *)&b);
  return;
}

Assistant:

void Farm::removeBasket() {
    int nif;

    getOption(nif, "Enter client's nif: ");
    if(!searchClientByNIF(nif)){
        cinERR("ERROR: Doesn't exists a client with the given nif, please create a new one!");
        enterWait();
        return;
    }

    const auto& cb_pair = baskets.find(nif);
    if(cb_pair == baskets.end()){
        cinERR("Client doesn't have any active baskets to delivery!");
        enterWait();
        return;
    }

    line(20);
    cout << "Client's baskets:" << endl;
    line(20);
    int i=0;
    for(Basket b: cb_pair->second){
        i++;
        cout << "ID: " << i << " | Weight: " << b.getWeight() << endl;
    }

    getOption(nif, "Enter ID of the basket to be removed: ", [&](int a){ return a > 0 && a < i; });
    cb_pair->second.erase(cb_pair->second.begin()+nif);

    clientsFileChanged = true;
    cout << "Basket successfully removed!" << endl;
    enterWait();
}